

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O3

void __thiscall
ParticleArrayTest_PushBack_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>::
TestBody(ParticleArrayTest_PushBack_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>
         *this)

{
  void *pvVar1;
  Particle<(pica::Dimension)1> particle;
  bool bVar2;
  long lVar3;
  int iVar4;
  AssertionResult gtest_ar_;
  ParticleArray particles;
  ParticleArray particlesCopy;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  AssertHelper local_1d0;
  AssertionResult local_1c8;
  char *local_1b8 [2];
  Particle local_1a8;
  ParticleArraySoA<pica::Particle<(pica::Dimension)1>_> local_170;
  ParticleArraySoA<pica::Particle<(pica::Dimension)1>_> local_c8;
  
  memset(&local_170,0,0xa8);
  iVar4 = 0x11;
  do {
    BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>::randomParticle
              (&local_1a8,(BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *)this,
               (PositionType)0xc024000000000000,(PositionType)0x4024000000000000);
    particle.p.x = local_1a8.p.x;
    particle.position.x = local_1a8.position.x;
    particle.p.y = local_1a8.p.y;
    particle.p.z = local_1a8.p.z;
    particle.factor = local_1a8.factor;
    particle.invGamma = local_1a8.invGamma;
    particle.typeIndex = local_1a8.typeIndex;
    particle._50_6_ = local_1a8._50_6_;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>>::
    pushBack<pica::Particle<(pica::Dimension)1>>
              ((ParticleArraySoA<pica::Particle<(pica::Dimension)1>> *)&local_170,particle);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>::ParticleArraySoA
            (&local_c8,&local_170);
  local_1c8.success_ =
       ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>::
       eqParticleArrays(&this->
                         super_ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>
                        ,&local_170,&local_c8);
  local_1c8.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!local_1c8.success_) {
    testing::Message::Message((Message *)&local_1d8);
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)local_1b8,&local_1c8,"this->eqParticleArrays(particles, particlesCopy)",
               "false","true");
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x75,local_1b8[0]);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1b8[0] != (char *)0x0) {
      operator_delete__(local_1b8[0]);
    }
    if (local_1d8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_1d8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_1d8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1c8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  if (local_c8.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.factors.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.factors.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  lVar3 = 0x48;
  do {
    pvVar1 = *(void **)((long)&local_c8.positions[0].
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&local_c8.positions[0].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage +
                                      lVar3) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0);
  if (local_c8.positions[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_170.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_170.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_170.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_170.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_170.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_170.factors.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.factors.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  lVar3 = 0x48;
  do {
    pvVar1 = *(void **)((long)&local_170.positions[0].
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&local_170.positions[0].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage +
                                      lVar3) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0);
  if (local_170.positions[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_170.positions[0].super__Vector_base<double,_std::allocator<double>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.positions[0].super__Vector_base<double,_std::allocator<double>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, PushBack)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles;
    for (int i = 0; i < 17; i++)
        particles.pushBack(this->randomParticle());
    ParticleArray particlesCopy(particles);
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesCopy));
}